

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9skin.cpp
# Opt level: O1

void * rw::d3d9::skinOpen(void *o,int32 param_2,int32 param_3)

{
  DAT_0014a2c0 = ObjPipeline::create();
  DAT_0014a2c0->instanceCB = skinInstanceCB;
  DAT_0014a2c0->uninstanceCB = (_func_void_Geometry_ptr_InstanceDataHeader_ptr *)0x0;
  DAT_0014a2c0->renderCB = skinRenderCB;
  (DAT_0014a2c0->super_ObjPipeline).super_Pipeline.pluginID = 0x116;
  (DAT_0014a2c0->super_ObjPipeline).super_Pipeline.pluginData = 1;
  return o;
}

Assistant:

static void*
skinOpen(void *o, int32, int32)
{
#ifdef RW_D3D9
	createSkinShaders();
#endif

	skinGlobals.pipelines[PLATFORM_D3D9] = makeSkinPipeline();
	return o;
}